

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O3

err_t dstuParamsVal(dstu_params *params)

{
  ec_o *ec_00;
  err_t eVar1;
  bool_t bVar2;
  size_t sVar3;
  void *stack;
  ec_o *ec;
  ec_o *local_20;
  
  local_20 = (ec_o *)0x0;
  eVar1 = dstuEcCreate(&local_20,params,dstuParamsVal_deep);
  ec_00 = local_20;
  if (eVar1 != 0) {
    return eVar1;
  }
  stack = (void *)((long)&(local_20->hdr).keep + (local_20->hdr).keep);
  sVar3 = wwBitSize(local_20->order,local_20->f->n);
  if ((((0xa0 < sVar3) && (bVar2 = ec2IsValid(ec_00,stack), bVar2 != 0)) &&
      (bVar2 = ec2SeemsValidGroup(ec_00,stack), bVar2 != 0)) &&
     (bVar2 = ec2IsSafeGroup(ec_00,0x20,stack), bVar2 != 0)) {
    bVar2 = ecHasOrderA(ec_00->base,ec_00,ec_00->order,ec_00->f->n,stack);
    eVar1 = 0;
    if (bVar2 != 0) goto LAB_00137e41;
  }
  eVar1 = 0x1f6;
LAB_00137e41:
  blobClose(ec_00);
  return eVar1;
}

Assistant:

err_t dstuParamsVal(const dstu_params* params)
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	void* stack;
	// старт
	code = dstuEcCreate(&ec, params, dstuParamsVal_deep);
	ERR_CALL_CHECK(code);
	stack = objEnd(ec, void);
	// проверить кривую и базовую точку
	if (wwBitSize(ec->order, ec->f->n) <= 160 ||
		!ec2IsValid(ec, stack) ||
		!ec2SeemsValidGroup(ec, stack) ||
		!ec2IsSafeGroup(ec, 32, stack) ||
		!ecHasOrderA(ec->base, ec, ec->order, ec->f->n, stack))
		code = ERR_BAD_PARAMS;
	// завершение
	dstuEcClose(ec);
	return code;
}